

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O3

void __thiscall duckdb::EnumTypeInfo::Serialize(EnumTypeInfo *this,Serializer *serializer)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  
  ExtraTypeInfo::Serialize(&this->super_ExtraTypeInfo,serializer);
  pdVar2 = (this->values_insert_order).data;
  (*serializer->_vptr_Serializer[2])(serializer,200,"values_count");
  (*serializer->_vptr_Serializer[0x15])(serializer,this->dict_size);
  (*serializer->_vptr_Serializer[3])(serializer);
  iVar1 = this->dict_size;
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"values");
  (*serializer->_vptr_Serializer[8])(serializer,iVar1);
  if (iVar1 != 0) {
    pdVar2 = pdVar2 + 8;
    do {
      (*serializer->_vptr_Serializer[0x1b])
                (serializer,*(undefined8 *)(pdVar2 + -8),*(undefined8 *)pdVar2);
      pdVar2 = pdVar2 + 0x10;
      iVar1 = iVar1 - 1;
    } while (iVar1 != 0);
  }
  (*serializer->_vptr_Serializer[9])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void EnumTypeInfo::Serialize(Serializer &serializer) const {
	ExtraTypeInfo::Serialize(serializer);

	// Enums are special in that we serialize their values as a list instead of dumping the whole vector
	auto strings = FlatVector::GetData<string_t>(values_insert_order);
	serializer.WriteProperty(200, "values_count", dict_size);
	serializer.WriteList(201, "values", dict_size,
	                     [&](Serializer::List &list, idx_t i) { list.WriteElement(strings[i]); });
}